

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void find_extensionsGLES1(void)

{
  get_exts();
  GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
  GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
  GLAD_GL_NV_fence = has_ext("GL_NV_fence");
  GLAD_GL_OES_single_precision = has_ext("GL_OES_single_precision");
  GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
  GLAD_GL_OES_byte_coordinates = has_ext("GL_OES_byte_coordinates");
  GLAD_GL_OES_query_matrix = has_ext("GL_OES_query_matrix");
  GLAD_GL_OES_read_format = has_ext("GL_OES_read_format");
  GLAD_GL_EXT_texture_lod_bias = has_ext("GL_EXT_texture_lod_bias");
  GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
  GLAD_GL_OES_fixed_point = has_ext("GL_OES_fixed_point");
  GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
  GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
  GLAD_GL_NV_fence = has_ext("GL_NV_fence");
  GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
  GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
  GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
  GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
  GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
  GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
  GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture = has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
  GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
  GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
  GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
  GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
  GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
  GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
  GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
  GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
  GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
  GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
  GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
  GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
  GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
  GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
  GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
  GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
  GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
  GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
  GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
  GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
  GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
  GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
  GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
  GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
  GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
  GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
  GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
  GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
  GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
  GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
  GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
  GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
  GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
  GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
  GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
  GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
  GLAD_GL_OES_texture_mirrored_repeat = has_ext("GL_OES_texture_mirrored_repeat");
  GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
  GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
  GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
  GLAD_GL_OES_single_precision = has_ext("GL_OES_single_precision");
  GLAD_GL_OES_point_size_array = has_ext("GL_OES_point_size_array");
  GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
  GLAD_GL_OES_texture_cube_map = has_ext("GL_OES_texture_cube_map");
  GLAD_GL_IMG_user_clip_plane = has_ext("GL_IMG_user_clip_plane");
  GLAD_GL_NV_fence = has_ext("GL_NV_fence");
  GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
  GLAD_GL_OES_blend_subtract = has_ext("GL_OES_blend_subtract");
  GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
  GLAD_GL_OES_read_format = has_ext("GL_OES_read_format");
  GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
  GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
  GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
  GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
  GLAD_GL_OES_extended_matrix_palette = has_ext("GL_OES_extended_matrix_palette");
  GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
  GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
  GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
  GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
  GLAD_GL_IMG_texture_env_enhanced_fixed_function =
       has_ext("GL_IMG_texture_env_enhanced_fixed_function");
  GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
  GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
  GLAD_GL_OES_fixed_point = has_ext("GL_OES_fixed_point");
  GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
  GLAD_GL_OES_matrix_palette = has_ext("GL_OES_matrix_palette");
  GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
  GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
  GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
  GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
  GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
  GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
  GLAD_GL_APPLE_texture_2D_limited_npot = has_ext("GL_APPLE_texture_2D_limited_npot");
  GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
  GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
  GLAD_GL_OES_query_matrix = has_ext("GL_OES_query_matrix");
  GLAD_GL_OES_point_sprite = has_ext("GL_OES_point_sprite");
  GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
  GLAD_GL_OES_stencil8 = has_ext("GL_OES_stencil8");
  GLAD_GL_OES_blend_equation_separate = has_ext("GL_OES_blend_equation_separate");
  GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
  GLAD_GL_OES_framebuffer_object = has_ext("GL_OES_framebuffer_object");
  GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
  GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
  GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
  GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
  GLAD_GL_EXT_texture_lod_bias = has_ext("GL_EXT_texture_lod_bias");
  GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture = has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
  GLAD_GL_OES_draw_texture = has_ext("GL_OES_draw_texture");
  GLAD_GL_OES_blend_func_separate = has_ext("GL_OES_blend_func_separate");
  GLAD_GL_OES_texture_env_crossbar = has_ext("GL_OES_texture_env_crossbar");
  GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
  GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
  GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
  GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
  GLAD_GL_OES_matrix_get = has_ext("GL_OES_matrix_get");
  GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
  GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
  GLAD_GL_OES_byte_coordinates = has_ext("GL_OES_byte_coordinates");
  GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
  GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
  GLAD_GL_OES_stencil_wrap = has_ext("GL_OES_stencil_wrap");
  GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
  GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
  GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
  GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
  GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
  return;
}

Assistant:

static void find_extensionsGLES1(void) {
	get_exts();
	GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
	GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
	GLAD_GL_NV_fence = has_ext("GL_NV_fence");
	GLAD_GL_OES_single_precision = has_ext("GL_OES_single_precision");
	GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
	GLAD_GL_OES_byte_coordinates = has_ext("GL_OES_byte_coordinates");
	GLAD_GL_OES_query_matrix = has_ext("GL_OES_query_matrix");
	GLAD_GL_OES_read_format = has_ext("GL_OES_read_format");
	GLAD_GL_EXT_texture_lod_bias = has_ext("GL_EXT_texture_lod_bias");
	GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
	GLAD_GL_OES_fixed_point = has_ext("GL_OES_fixed_point");
	GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
	GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
	GLAD_GL_NV_fence = has_ext("GL_NV_fence");
	GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
	GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
	GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
	GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
	GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
	GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
	GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture = has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
	GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
	GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
	GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
	GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
	GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
	GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
	GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
	GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
	GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
	GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
	GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
	GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
	GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
	GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
	GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
	GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
	GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
	GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
	GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
	GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
	GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
	GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
	GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
	GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
	GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
	GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
	GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
	GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
	GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
	GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
	GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
	GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
	GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
	GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
	GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
	GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
	GLAD_GL_OES_texture_mirrored_repeat = has_ext("GL_OES_texture_mirrored_repeat");
	GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
	GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
	GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
	GLAD_GL_OES_single_precision = has_ext("GL_OES_single_precision");
	GLAD_GL_OES_point_size_array = has_ext("GL_OES_point_size_array");
	GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
	GLAD_GL_OES_texture_cube_map = has_ext("GL_OES_texture_cube_map");
	GLAD_GL_IMG_user_clip_plane = has_ext("GL_IMG_user_clip_plane");
	GLAD_GL_NV_fence = has_ext("GL_NV_fence");
	GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
	GLAD_GL_OES_blend_subtract = has_ext("GL_OES_blend_subtract");
	GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
	GLAD_GL_OES_read_format = has_ext("GL_OES_read_format");
	GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
	GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
	GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
	GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
	GLAD_GL_OES_extended_matrix_palette = has_ext("GL_OES_extended_matrix_palette");
	GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
	GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
	GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
	GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
	GLAD_GL_IMG_texture_env_enhanced_fixed_function = has_ext("GL_IMG_texture_env_enhanced_fixed_function");
	GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
	GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
	GLAD_GL_OES_fixed_point = has_ext("GL_OES_fixed_point");
	GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
	GLAD_GL_OES_matrix_palette = has_ext("GL_OES_matrix_palette");
	GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
	GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
	GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
	GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
	GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
	GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
	GLAD_GL_APPLE_texture_2D_limited_npot = has_ext("GL_APPLE_texture_2D_limited_npot");
	GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
	GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
	GLAD_GL_OES_query_matrix = has_ext("GL_OES_query_matrix");
	GLAD_GL_OES_point_sprite = has_ext("GL_OES_point_sprite");
	GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
	GLAD_GL_OES_stencil8 = has_ext("GL_OES_stencil8");
	GLAD_GL_OES_blend_equation_separate = has_ext("GL_OES_blend_equation_separate");
	GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
	GLAD_GL_OES_framebuffer_object = has_ext("GL_OES_framebuffer_object");
	GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
	GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
	GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
	GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
	GLAD_GL_EXT_texture_lod_bias = has_ext("GL_EXT_texture_lod_bias");
	GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture = has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
	GLAD_GL_OES_draw_texture = has_ext("GL_OES_draw_texture");
	GLAD_GL_OES_blend_func_separate = has_ext("GL_OES_blend_func_separate");
	GLAD_GL_OES_texture_env_crossbar = has_ext("GL_OES_texture_env_crossbar");
	GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
	GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
	GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
	GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
	GLAD_GL_OES_matrix_get = has_ext("GL_OES_matrix_get");
	GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
	GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
	GLAD_GL_OES_byte_coordinates = has_ext("GL_OES_byte_coordinates");
	GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
	GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
	GLAD_GL_OES_stencil_wrap = has_ext("GL_OES_stencil_wrap");
	GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
	GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
	GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
	GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
	GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
}